

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O2

void Imath_3_2::minEigenVector<Imath_3_2::Matrix33<double>,Imath_3_2::Vec3<double>>
               (Matrix33<double> *A,Vec3<double> *V)

{
  int iVar1;
  uint i;
  long lVar2;
  double *pdVar3;
  int iVar4;
  Vec3<double> S;
  Matrix33<double> MV;
  
  MV.x[0][0] = 1.0;
  MV.x[1][0] = 0.0;
  MV.x[0][1] = 0.0;
  MV.x[0][2] = 0.0;
  MV.x[1][1] = 1.0;
  MV.x[1][2] = 0.0;
  MV.x[2][0] = 0.0;
  MV.x[2][1] = 0.0;
  MV.x[2][2] = 1.0;
  jacobiEigenSolver<double>(A,&S,&MV);
  iVar4 = 0;
  for (lVar2 = 1; lVar2 != 3; lVar2 = lVar2 + 1) {
    iVar1 = (int)lVar2;
    if (ABS(*(double *)((long)(MV.x + -1) + (long)iVar4 * 8)) <=
        ABS(*(double *)((long)(MV.x + -1) + lVar2 * 8))) {
      iVar1 = iVar4;
    }
    iVar4 = iVar1;
  }
  pdVar3 = (double *)((long)(MV.x + -1) + (long)iVar4 * 8);
  for (lVar2 = 0; pdVar3 = pdVar3 + 3, lVar2 != 3; lVar2 = lVar2 + 1) {
    (&V->x)[lVar2] = *pdVar3;
  }
  return;
}

Assistant:

void
minEigenVector (TM& A, TV& V)
{
    TV S;
    TM MV;
    jacobiEigenSolver (A, S, MV);

    int minIdx (0);
    for (unsigned int i = 1; i < TV::dimensions (); ++i)
    {
        if (std::abs (S[i]) < std::abs (S[minIdx])) minIdx = i;
    }

    for (unsigned int i = 0; i < TV::dimensions (); ++i)
        V[i] = MV[i][minIdx];
}